

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O3

void __thiscall
pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
move_construct<pstore::romfs::directory_const*>
          (error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>> *this,
          error_or<const_pstore::romfs::directory_*> *rhs)

{
  error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>> eVar1;
  error_code *peVar2;
  not_null<const_pstore::romfs::directory_*> *this_00;
  directory **ppdVar3;
  error_code eVar4;
  
  eVar1 = (error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>)rhs->has_error_;
  this[0x10] = eVar1;
  if (eVar1 == (error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>)0x1) {
    peVar2 = error_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,std::error_code>
                       ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)this);
    eVar4 = error_or<const_pstore::romfs::directory_*>::get_error(rhs);
    peVar2->_M_value = eVar4._M_value;
    peVar2->_M_cat = eVar4._M_cat;
    return;
  }
  this_00 = value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,pstore::gsl::not_null<pstore::romfs::directory_const*>>
                      ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)this);
  ppdVar3 = error_or<pstore::romfs::directory_const*>::
            value_storage_impl<pstore::error_or<pstore::romfs::directory_const*>&,pstore::romfs::directory_const*>
                      (rhs);
  this_00->ptr_ = *ppdVar3;
  pstore::gsl::not_null<const_pstore::romfs::directory_*>::ensure_invariant(this_00);
  return;
}

Assistant:

void error_or<T>::move_construct (error_or<Other> && rhs) noexcept {
        has_error_ = rhs.has_error_;
        if (has_error_) {
            new (get_error_storage ()) std::error_code (rhs.get_error ());
        } else {
            new (get_storage ()) storage_type (std::move (*rhs.get_storage ()));
        }
    }